

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::MapAndRemoveIf<TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record()::__0>
          (BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,anon_class_8_1_8991fb9c fn)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int nextIndex;
  int lastIndex;
  int currentIndex;
  uint i;
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  anon_class_8_1_8991fb9c fn_local;
  
  this_local = (BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)fn.this;
  for (lastIndex = 0; (uint)lastIndex < *(uint *)(this + 0x1c); lastIndex = lastIndex + 1) {
    if (*(int *)(*(long *)this + (ulong)(uint)lastIndex * 4) != -1) {
      local_24 = -1;
      nextIndex = *(int *)(*(long *)this + (ulong)(uint)lastIndex * 4);
      while (nextIndex != -1) {
        bVar2 = TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record::anon_class_8_1_8991fb9c::
                operator()((anon_class_8_1_8991fb9c *)&this_local,
                           (SimpleDictionaryEntry<unsigned_long,_Js::RecyclableObject_*> *)
                           (*(long *)(this + 8) + (long)nextIndex * 0x18));
        if (bVar2) {
          iVar1 = *(int *)(*(long *)(this + 8) + (long)nextIndex * 0x18 + 8);
          BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::RemoveAt((BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)this,nextIndex,local_24,lastIndex);
          nextIndex = iVar1;
        }
        else {
          local_24 = nextIndex;
          nextIndex = *(int *)(*(long *)(this + 8) + (long)nextIndex * 0x18 + 8);
        }
      }
    }
  }
  return;
}

Assistant:

void MapAndRemoveIf(Fn fn)
        {
            for (uint i = 0; i < bucketCount; i++)
            {
                if (buckets[i] != -1)
                {
                    for (int currentIndex = buckets[i], lastIndex = -1; currentIndex != -1;)
                    {
                        // If the predicate says we should remove this item
                        if (fn(entries[currentIndex]) == true)
                        {
                            const int nextIndex = entries[currentIndex].next;
                            RemoveAt(currentIndex, lastIndex, i);
                            currentIndex = nextIndex;
                        }
                        else
                        {
                            lastIndex = currentIndex;
                            currentIndex = entries[currentIndex].next;
                        }
                    }
                }
            }
        }